

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.hpp
# Opt level: O3

void __thiscall Volume::Volume(Volume *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  ObjCompFunctor local_10;
  
  local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10.objs = &this->objs;
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
  ::priority_queue(&this->heap,&local_10,&local_28);
  if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->objs).super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->objs).super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->objs).super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Volume(): heap(ObjCompFunctor(objs)) {}